

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_char,unsigned_char>
          (Thread *this,BinopFunc<unsigned_char,_unsigned_char> *f)

{
  uchar uVar1;
  uchar uVar2;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar3;
  byte local_3a;
  undefined1 uStack_39;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  u8 i;
  SR result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  uchar amount;
  BinopFunc<unsigned_char,_unsigned_char> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_char>(this);
  SVar3 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  result.v[8] = SVar3.v[0];
  result.v[9] = SVar3.v[1];
  result.v[10] = SVar3.v[2];
  result.v[0xb] = SVar3.v[3];
  result.v[0xc] = SVar3.v[4];
  result.v[0xd] = SVar3.v[5];
  result.v[0xe] = SVar3.v[6];
  result.v[0xf] = SVar3.v[7];
  lhs.v[0] = SVar3.v[8];
  lhs.v[1] = SVar3.v[9];
  lhs.v[2] = SVar3.v[10];
  lhs.v[3] = SVar3.v[0xb];
  lhs.v[4] = SVar3.v[0xc];
  lhs.v[5] = SVar3.v[0xd];
  lhs.v[6] = SVar3.v[0xe];
  lhs.v[7] = SVar3.v[0xf];
  for (local_3a = 0; local_3a < 0x10; local_3a = local_3a + 1) {
    uVar2 = (*f)(result.v[(ulong)local_3a + 8],uVar1);
    lhs.v[(ulong)local_3a - 0x18] = uVar2;
  }
  SVar3.v[8] = result.v[0];
  SVar3.v[9] = result.v[1];
  SVar3.v[10] = result.v[2];
  SVar3.v[0xb] = result.v[3];
  SVar3.v[0xc] = result.v[4];
  SVar3.v[0xd] = result.v[5];
  SVar3.v[0xe] = result.v[6];
  SVar3.v[0xf] = result.v[7];
  SVar3.v[0] = uStack_39;
  SVar3.v[1] = uStack_38;
  SVar3.v[2] = uStack_37;
  SVar3.v[3] = uStack_36;
  SVar3.v[4] = uStack_35;
  SVar3.v[5] = uStack_34;
  SVar3.v[6] = uStack_33;
  SVar3.v[7] = i;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,SVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<T>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}